

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::CheckerInstanceSymbol::Connection::getOutputInitialExpr(Connection *this)

{
  bool bVar1;
  Expression **ppEVar2;
  ASTContext *in_RDI;
  LookupLocation LVar3;
  ASTContext context;
  void **in_stack_ffffffffffffff58;
  Symbol **__t;
  Symbol *in_stack_ffffffffffffff60;
  AssertionInstanceDetails *this_00;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff70;
  socklen_t __len;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  Scope *local_78;
  undefined8 local_70;
  bitmask<slang::ast::ASTFlags> local_68;
  Scope *local_60;
  uint32_t local_58;
  Scope *local_50;
  uint32_t local_48;
  sockaddr local_40 [4];
  
  bVar1 = std::optional::operator_cast_to_bool((optional<const_slang::ast::Expression_*> *)0x369815)
  ;
  if (!bVar1) {
    if (in_RDI->assertionInstance == (AssertionInstanceDetails *)0x0) {
      std::optional<slang::ast::Expression_const*>::operator=
                ((optional<const_slang::ast::Expression_*> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58);
    }
    else {
      __t = &(in_RDI->scope).ptr[1].thisSym;
      LVar3 = LookupLocation::after(in_stack_ffffffffffffff60);
      local_60 = LVar3.scope;
      local_58 = LVar3.index;
      local_50 = local_60;
      local_48 = local_58;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_68,None);
      LVar3._8_8_ = in_stack_ffffffffffffff80;
      LVar3.scope = (Scope *)in_stack_ffffffffffffff78.m_bits;
      ASTContext::ASTContext
                (in_RDI,(Scope *)in_stack_ffffffffffffff60,LVar3,in_stack_ffffffffffffff70);
      __len = (socklen_t)in_stack_ffffffffffffff78.m_bits;
      this_00 = in_RDI->assertionInstance;
      bitmask<slang::ast::ASTFlags>::bitmask
                ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff78,None);
      Expression::bind((int)this_00,local_40,__len);
      std::optional<const_slang::ast::Expression_*>::optional<const_slang::ast::Expression_*,_true>
                ((optional<const_slang::ast::Expression_*> *)this_00,(Expression **)__t);
      in_RDI[1].scope.ptr = local_78;
      *(undefined8 *)&in_RDI[1].lookupIndex = local_70;
    }
  }
  ppEVar2 = std::optional<const_slang::ast::Expression_*>::operator*
                      ((optional<const_slang::ast::Expression_*> *)0x369914);
  return *ppEVar2;
}

Assistant:

const Expression* CheckerInstanceSymbol::Connection::getOutputInitialExpr() const {
    if (!outputInitialExpr) {
        if (outputInitialSyntax) {
            ASTContext context(parent, LookupLocation::after(formal));
            outputInitialExpr = &Expression::bind(*outputInitialSyntax, context);
        }
        else {
            outputInitialExpr = nullptr;
        }
    }
    return *outputInitialExpr;
}